

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# uintwide_t.h
# Opt level: O0

uintwide_t<4096U,_unsigned_int,_void,_false> * __thiscall
math::wide_integer::uintwide_t<4096U,_unsigned_int,_void,_false>::operator+=
          (uintwide_t<4096U,_unsigned_int,_void,_false> *this,
          uintwide_t<4096U,_unsigned_int,_void,_false> *other)

{
  iterator puVar1;
  const_iterator puVar2;
  const_iterator puVar3;
  limb_type carry_1;
  limb_type carry;
  uintwide_t<4096U,_unsigned_int,_void,_false> self;
  uintwide_t<4096U,_unsigned_int,_void,_false> *other_local;
  uintwide_t<4096U,_unsigned_int,_void,_false> *this_local;
  
  self.values.super_array<unsigned_int,_128UL>.elems._504_8_ = other;
  if (this == other) {
    memcpy(&carry_1,other,0x200);
    puVar1 = detail::array_detail::array<unsigned_int,_128UL>::begin
                       ((array<unsigned_int,_128UL> *)this);
    puVar2 = detail::array_detail::array<unsigned_int,_128UL>::cbegin
                       ((array<unsigned_int,_128UL> *)this);
    puVar3 = detail::array_detail::array<unsigned_int,_128UL>::cbegin
                       ((array<unsigned_int,_128UL> *)&carry_1);
    uintwide_t<4096u,unsigned_int,void,false>::
    eval_add_n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>(puVar1,puVar2,puVar3,0x80,0);
  }
  else {
    puVar1 = detail::array_detail::array<unsigned_int,_128UL>::begin
                       ((array<unsigned_int,_128UL> *)this);
    puVar2 = detail::array_detail::array<unsigned_int,_128UL>::cbegin
                       ((array<unsigned_int,_128UL> *)this);
    puVar3 = detail::array_detail::array<unsigned_int,_128UL>::cbegin
                       ((array<unsigned_int,_128UL> *)
                        self.values.super_array<unsigned_int,_128UL>.elems._504_8_);
    uintwide_t<4096u,unsigned_int,void,false>::
    eval_add_n<unsigned_int*,unsigned_int_const*,unsigned_int_const*>(puVar1,puVar2,puVar3,0x80,0);
  }
  return this;
}

Assistant:

constexpr auto operator+=(const uintwide_t& other) -> uintwide_t&
    {
      if(this == &other)
      {
        const uintwide_t self(other); // NOLINT(performance-unnecessary-copy-initialization)

        // Unary addition function.
        const auto carry = eval_add_n(values.begin(), // LCOV_EXCL_LINE
                                      values.cbegin(),
                                      self.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }
      else
      {
        // Unary addition function.
        const auto carry = eval_add_n(values.begin(),
                                      values.cbegin(),
                                      other.values.cbegin(),
                                      static_cast<unsigned_fast_type>(number_of_limbs),
                                      static_cast<limb_type>(UINT8_C(0)));

        static_cast<void>(carry);
      }

      return *this;
    }